

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_tq1_0(block_tq1_0 *x,float *y,int64_t k)

{
  long in_RDX;
  float *in_RSI;
  long in_RDI;
  float fVar1;
  int16_t xi_2;
  uint8_t q_2;
  size_t j_2;
  size_t n_2;
  int16_t xi_1;
  uint8_t q_1;
  size_t m_1;
  size_t n_1;
  size_t j_1;
  int16_t xi;
  uint8_t q;
  size_t m;
  size_t n;
  size_t j;
  float d;
  int64_t i;
  uint8_t pow3 [6];
  int64_t nb;
  ulong local_88;
  ulong local_80;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_30;
  char local_26 [6];
  long local_20;
  float *local_10;
  long local_8;
  
  local_20 = in_RDX / 0x100;
  local_26[0] = '\x01';
  local_26[1] = '\x03';
  local_26[2] = '\t';
  local_26[3] = '\x1b';
  local_26[4] = 'Q';
  local_26[5] = -0xd;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < local_20; local_30 = local_30 + 1) {
    fVar1 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_8 + local_30 * 0x36 + 0x34));
    for (local_40 = 0; local_40 < 0x20; local_40 = local_40 + 0x20) {
      for (local_48 = 0; local_48 < 5; local_48 = local_48 + 1) {
        for (local_50 = 0; local_50 < 0x20; local_50 = local_50 + 1) {
          *local_10 = (float)((short)((uint)(byte)(*(char *)(local_8 + local_30 * 0x36 +
                                                            local_40 + local_50) *
                                                  local_26[local_48]) * 3 >> 8) + -1) * fVar1;
          local_10 = local_10 + 1;
        }
      }
    }
    for (local_60 = 0x20; local_60 < 0x30; local_60 = local_60 + 0x10) {
      for (local_68 = 0; local_68 < 5; local_68 = local_68 + 1) {
        for (local_70 = 0; local_70 < 0x10; local_70 = local_70 + 1) {
          *local_10 = (float)((short)((uint)(byte)(*(char *)(local_8 + local_30 * 0x36 +
                                                            local_60 + local_70) *
                                                  local_26[local_68]) * 3 >> 8) + -1) * fVar1;
          local_10 = local_10 + 1;
        }
      }
    }
    for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
      for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
        *local_10 = (float)((short)((uint)(byte)(*(char *)(local_8 + local_30 * 0x36 + 0x30 +
                                                          local_88) * local_26[local_80]) * 3 >> 8)
                           + -1) * fVar1;
        local_10 = local_10 + 1;
      }
    }
  }
  return;
}

Assistant:

void dequantize_row_tq1_0(const block_tq1_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    const uint8_t pow3[6] = {1, 3, 9, 27, 81, 243};

    for (int64_t i = 0; i < nb; ++i) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (size_t j = 0; j < sizeof(x->qs) - sizeof(x->qs) % 32; j += 32) {
            for (size_t n = 0; n < 5; ++n) {
                for (size_t m = 0; m < 32; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[n];
                    int16_t xi = ((uint16_t) q * 3) >> 8;
                    *y++ = (float) (xi - 1) * d;
                }
            }
        }
        for (size_t j = sizeof(x->qs) - sizeof(x->qs) % 32; j < sizeof(x->qs); j += 16) {
            for (size_t n = 0; n < 5; ++n) {
                for (size_t m = 0; m < 16; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[n];
                    int16_t xi = ((uint16_t) q * 3) >> 8;
                    *y++ = (float) (xi - 1) * d;
                }
            }
        }

        for (size_t n = 0; n < 4; ++n) {
            for (size_t j = 0; j < sizeof(x->qh); ++j) {
                uint8_t q = x[i].qh[j] * pow3[n];
                int16_t xi = ((uint16_t) q * 3) >> 8;
                *y++ = (float) (xi - 1) * d;
            }
        }
    }
}